

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void __thiscall ExampleAppConsole::ExecCommand(ExampleAppConsole *this,char *command_line)

{
  char **ppcVar1;
  int iVar2;
  char *pcVar3;
  char **__dest;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  AddLog(this,"# %s\n",command_line);
  this->HistoryPos = -1;
  uVar6 = (ulong)(uint)(this->History).Size;
  lVar8 = uVar6 + 1;
  do {
    lVar7 = lVar8;
    iVar5 = (int)uVar6;
    if (iVar5 < 1) goto LAB_001631d1;
    if ((this->History).Size < iVar5) goto LAB_00163371;
    iVar2 = Stricmp((this->History).Data[lVar7 + -2],command_line);
    lVar8 = lVar7 + -1;
    uVar6 = (ulong)(iVar5 - 1);
  } while (iVar2 != 0);
  if ((this->History).Size < (int)lVar8) {
LAB_00163371:
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                  ,0x703,"T &ImVector<char *>::operator[](int) [T = char *]");
  }
  free((this->History).Data[lVar7 + -2]);
  iVar5 = (this->History).Size;
  if (iVar5 < (int)lVar8) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                  ,0x71b,"T *ImVector<char *>::erase(const T *) [T = char *]");
  }
  ppcVar1 = (this->History).Data;
  memmove(ppcVar1 + lVar7 + -2,ppcVar1 + lVar8,(iVar5 - lVar8) * 8);
  (this->History).Size = (this->History).Size + -1;
LAB_001631d1:
  pcVar3 = Strdup(command_line);
  iVar5 = (this->History).Size;
  iVar2 = (this->History).Capacity;
  if (iVar5 == iVar2) {
    iVar5 = iVar5 + 1;
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar2 < iVar5) {
      __dest = (char **)ImGui::MemAlloc((long)iVar5 << 3);
      ppcVar1 = (this->History).Data;
      if (ppcVar1 != (char **)0x0) {
        memcpy(__dest,ppcVar1,(long)(this->History).Size << 3);
        ImGui::MemFree((this->History).Data);
      }
      (this->History).Data = __dest;
      (this->History).Capacity = iVar5;
    }
  }
  (this->History).Data[(this->History).Size] = pcVar3;
  (this->History).Size = (this->History).Size + 1;
  iVar5 = Stricmp(command_line,"CLEAR");
  if (iVar5 == 0) {
    ClearLog(this);
  }
  else {
    iVar5 = Stricmp(command_line,"HELP");
    if (iVar5 == 0) {
      AddLog(this,"Commands:");
      if (0 < (this->Commands).Size) {
        lVar8 = 0;
        do {
          AddLog(this,"- %s",(this->Commands).Data[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 < (this->Commands).Size);
      }
    }
    else {
      iVar5 = Stricmp(command_line,"HISTORY");
      if (iVar5 == 0) {
        iVar5 = (this->History).Size;
        iVar2 = 10;
        if (10 < iVar5) {
          iVar2 = iVar5;
        }
        if ((int)(iVar2 - 10U) < iVar5) {
          uVar6 = (ulong)(iVar2 - 10U);
          do {
            AddLog(this,"%3d: %s\n",uVar6 & 0xffffffff,(this->History).Data[uVar6]);
            uVar6 = uVar6 + 1;
          } while ((int)uVar6 < (this->History).Size);
        }
      }
      else {
        AddLog(this,"Unknown command: \'%s\'\n",command_line);
      }
    }
  }
  this->ScrollToBottom = true;
  return;
}

Assistant:

void    ExecCommand(const char* command_line)
    {
        AddLog("# %s\n", command_line);

        // Insert into history. First find match and delete it so it can be pushed to the back.
        // This isn't trying to be smart or optimal.
        HistoryPos = -1;
        for (int i = History.Size - 1; i >= 0; i--)
            if (Stricmp(History[i], command_line) == 0)
            {
                free(History[i]);
                History.erase(History.begin() + i);
                break;
            }
        History.push_back(Strdup(command_line));

        // Process command
        if (Stricmp(command_line, "CLEAR") == 0)
        {
            ClearLog();
        }
        else if (Stricmp(command_line, "HELP") == 0)
        {
            AddLog("Commands:");
            for (int i = 0; i < Commands.Size; i++)
                AddLog("- %s", Commands[i]);
        }
        else if (Stricmp(command_line, "HISTORY") == 0)
        {
            int first = History.Size - 10;
            for (int i = first > 0 ? first : 0; i < History.Size; i++)
                AddLog("%3d: %s\n", i, History[i]);
        }
        else
        {
            AddLog("Unknown command: '%s'\n", command_line);
        }

        // On command input, we scroll to bottom even if AutoScroll==false
        ScrollToBottom = true;
    }